

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O0

UStringTrieResult __thiscall
icu_63::BytesTrie::branchNext(BytesTrie *this,uint8_t *pos,int32_t length,int32_t inByte)

{
  uint node_00;
  byte *pbVar1;
  byte *pos_00;
  UStringTrieResult local_48;
  UStringTrieResult local_44;
  uint local_34;
  int32_t node_1;
  int32_t delta;
  int32_t node;
  UStringTrieResult result;
  int32_t inByte_local;
  int32_t length_local;
  uint8_t *pos_local;
  BytesTrie *this_local;
  
  result = length;
  _inByte_local = pos;
  if (length == 0) {
    _inByte_local = pos + 1;
    result = (UStringTrieResult)*pos;
  }
  result = result + USTRINGTRIE_NO_VALUE;
  while (5 < (int)result) {
    if (inByte < (int)(uint)*_inByte_local) {
      _inByte_local = jumpByDelta(_inByte_local + 1);
      result = (int)result >> 1;
    }
    else {
      result = result - ((int)result >> 1);
      _inByte_local = skipDelta(_inByte_local + 1);
    }
  }
  do {
    pos_00 = _inByte_local + 1;
    if (inByte == (uint)*_inByte_local) {
      if ((*pos_00 & 1) == 0) {
        pbVar1 = _inByte_local + 2;
        local_34 = (int)(uint)*pos_00 >> 1;
        if (local_34 < 0x51) {
          local_34 = local_34 - 0x10;
          _inByte_local = pbVar1;
        }
        else if (local_34 < 0x6c) {
          _inByte_local = _inByte_local + 3;
          local_34 = (local_34 - 0x51) * 0x100 | (uint)*pbVar1;
        }
        else if (local_34 < 0x7e) {
          local_34 = (local_34 - 0x6c) * 0x10000 | (uint)*pbVar1 << 8 | (uint)_inByte_local[3];
          _inByte_local = _inByte_local + 4;
        }
        else if (local_34 == 0x7e) {
          local_34 = (uint)*pbVar1 << 0x10 | (uint)_inByte_local[3] << 8 | (uint)_inByte_local[4];
          _inByte_local = _inByte_local + 5;
        }
        else {
          local_34 = (uint)*pbVar1 << 0x18 | (uint)_inByte_local[3] << 0x10 |
                     (uint)_inByte_local[4] << 8 | (uint)_inByte_local[5];
          _inByte_local = _inByte_local + 6;
        }
        _inByte_local = _inByte_local + (int)local_34;
        if (*_inByte_local < 0x20) {
          local_44 = USTRINGTRIE_NO_VALUE;
        }
        else {
          local_44 = valueResult((uint)*_inByte_local);
        }
        delta = local_44;
      }
      else {
        delta = 2;
        _inByte_local = pos_00;
      }
      this->pos_ = _inByte_local;
      return delta;
    }
    result = result - USTRINGTRIE_NO_VALUE;
    _inByte_local = skipValue(pos_00);
  } while (1 < (int)result);
  if (inByte == (uint)*_inByte_local) {
    this->pos_ = _inByte_local + 1;
    node_00 = (uint)_inByte_local[1];
    if (node_00 < 0x20) {
      local_48 = USTRINGTRIE_NO_VALUE;
    }
    else {
      local_48 = valueResult(node_00);
    }
    this_local._4_4_ = local_48;
  }
  else {
    stop(this);
    this_local._4_4_ = USTRINGTRIE_NO_MATCH;
  }
  return this_local._4_4_;
}

Assistant:

UStringTrieResult
BytesTrie::branchNext(const uint8_t *pos, int32_t length, int32_t inByte) {
    // Branch according to the current byte.
    if(length==0) {
        length=*pos++;
    }
    ++length;
    // The length of the branch is the number of bytes to select from.
    // The data structure encodes a binary search.
    while(length>kMaxBranchLinearSubNodeLength) {
        if(inByte<*pos++) {
            length>>=1;
            pos=jumpByDelta(pos);
        } else {
            length=length-(length>>1);
            pos=skipDelta(pos);
        }
    }
    // Drop down to linear search for the last few bytes.
    // length>=2 because the loop body above sees length>kMaxBranchLinearSubNodeLength>=3
    // and divides length by 2.
    do {
        if(inByte==*pos++) {
            UStringTrieResult result;
            int32_t node=*pos;
            U_ASSERT(node>=kMinValueLead);
            if(node&kValueIsFinal) {
                // Leave the final value for getValue() to read.
                result=USTRINGTRIE_FINAL_VALUE;
            } else {
                // Use the non-final value as the jump delta.
                ++pos;
                // int32_t delta=readValue(pos, node>>1);
                node>>=1;
                int32_t delta;
                if(node<kMinTwoByteValueLead) {
                    delta=node-kMinOneByteValueLead;
                } else if(node<kMinThreeByteValueLead) {
                    delta=((node-kMinTwoByteValueLead)<<8)|*pos++;
                } else if(node<kFourByteValueLead) {
                    delta=((node-kMinThreeByteValueLead)<<16)|(pos[0]<<8)|pos[1];
                    pos+=2;
                } else if(node==kFourByteValueLead) {
                    delta=(pos[0]<<16)|(pos[1]<<8)|pos[2];
                    pos+=3;
                } else {
                    delta=(pos[0]<<24)|(pos[1]<<16)|(pos[2]<<8)|pos[3];
                    pos+=4;
                }
                // end readValue()
                pos+=delta;
                node=*pos;
                result= node>=kMinValueLead ? valueResult(node) : USTRINGTRIE_NO_VALUE;
            }
            pos_=pos;
            return result;
        }
        --length;
        pos=skipValue(pos);
    } while(length>1);
    if(inByte==*pos++) {
        pos_=pos;
        int32_t node=*pos;
        return node>=kMinValueLead ? valueResult(node) : USTRINGTRIE_NO_VALUE;
    } else {
        stop();
        return USTRINGTRIE_NO_MATCH;
    }
}